

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

void __thiscall
de::FilePath::FilePath
          (FilePath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *components)

{
  char cVar1;
  size_type sVar2;
  size_t ndx;
  ulong uVar3;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(components->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(components->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    sVar2 = (this->m_path)._M_string_length;
    if (((sVar2 != 0) && (cVar1 = (this->m_path)._M_dataplus._M_p[sVar2 - 1], cVar1 != '/')) &&
       (cVar1 != '\\')) {
      std::__cxx11::string::append((string *)this);
    }
    std::__cxx11::string::append((string *)this);
  }
  return;
}

Assistant:

FilePath::FilePath (const std::vector<std::string>& components)
{
	for (size_t ndx = 0; ndx < components.size(); ndx++)
	{
		if (!m_path.empty() && !isSeparator(m_path[m_path.size()-1]))
			m_path += separator;
		m_path += components[ndx];
	}
}